

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int bc_get_sleb128(BCReaderState *s,int32_t *pval)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = get_sleb128(pval,s->ptr,s->buf_end);
  if ((int)uVar1 < 0) {
    if (s->error_state == 0) {
      JS_ThrowSyntaxError(s->ctx,"read after the end of the buffer");
    }
    s->error_state = -1;
    iVar2 = -1;
  }
  else {
    s->ptr = s->ptr + uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int bc_get_sleb128(BCReaderState *s, int32_t *pval)
{
    int ret;
    ret = get_sleb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}